

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O0

void __thiscall fmcalc::init_profile_rec(fmcalc *this,fm_profile *f)

{
  size_type sVar1;
  reference this_00;
  undefined1 local_38 [8];
  profile_rec_new p;
  fm_profile *f_local;
  fmcalc *this_local;
  
  p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)f;
  profile_rec_new::profile_rec_new((profile_rec_new *)local_38);
  local_38._0_4_ =
       *(undefined4 *)
        &(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->tc_id;
  switch(local_38._0_4_) {
  case 1:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 2:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 3:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 4:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 5:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 6:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 7:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 8:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 9:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 10:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0xb:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0xc:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0xd:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0xe:
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0xf:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x10:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x11:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x12:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x13:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x14:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x15:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  default:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\a',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[4].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\b',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[4].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x17:
    add_tc('\a',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[4].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\b',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[4].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x18:
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\a',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[4].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\b',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[4].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x19:
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\a',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[4].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\b',*(OASIS_FLOAT *)
                 &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[4].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x1a:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x21:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x22:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x06',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[3].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x03',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[2].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x23:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    break;
  case 0x24:
    add_tc('\0',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x01',*(OASIS_FLOAT *)
                   &p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[1].tc_id,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x02',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[2].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
    add_tc('\x04',p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[3].tc_val,
           (vector<tc_rec,_std::allocator<tc_rec>_> *)&p);
  }
  sVar1 = std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::size
                    (&this->profile_vec_new_);
  if (sVar1 < (long)(int)(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->tc_val + 1U) {
    std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::resize
              (&this->profile_vec_new_,
               (long)((int)(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)->tc_val + 1));
  }
  this_00 = std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::operator[]
                      (&this->profile_vec_new_,
                       (long)(int)(p.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage)->tc_val);
  profile_rec_new::operator=(this_00,(profile_rec_new *)local_38);
  profile_rec_new::~profile_rec_new((profile_rec_new *)local_38);
  return;
}

Assistant:

void fmcalc::init_profile_rec(fm_profile &f)
{
	profile_rec_new p;
	p.calcrule_id = f.calcrule_id;
	switch (p.calcrule_id) {
		case 1:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 2:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 3:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 4:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 5:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 6:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 7:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 8:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 9:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 10:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 11:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			break;
		case 12:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 13:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 14:
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 15:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 16:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 17:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 18:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 19:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 20:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 21:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			break;
		case 23:
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 24:
			add_tc(attachment_1, f.attachment, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 25:
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
			break;
		case 26:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 33:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 34:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 35:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		case 36:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			break;
		default:
		{
			//fprintf(stderr, "Found calrule %d\n", p.calcrule_id);
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(deductible_2, f.deductible2, p.tc_vec);
			add_tc(deductible_3, f.deductible3, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			add_tc(limit_1, f.limit, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(share_2, f.share2, p.tc_vec);
			add_tc(share_3, f.share3, p.tc_vec);
		}

	}
	if (profile_vec_new_.size() < (size_t)f.profile_id + 1) {
		profile_vec_new_.resize(f.profile_id + 1);
	}
	profile_vec_new_[f.profile_id] = p;
}